

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

IAnimatedMeshSceneNode * __thiscall
irr::scene::CSceneManager::addAnimatedMeshSceneNode
          (CSceneManager *this,IAnimatedMesh *mesh,ISceneNode *parent,s32 id,vector3df *position,
          vector3df *rotation,vector3df *scale,bool alsoAddIfMeshPointerZero)

{
  int *piVar1;
  long lVar2;
  CAnimatedMeshSceneNode *this_00;
  ISceneNode *parent_00;
  
  if (mesh == (IAnimatedMesh *)0x0 && !alsoAddIfMeshPointerZero) {
    this_00 = (CAnimatedMeshSceneNode *)0x0;
  }
  else {
    parent_00 = (ISceneNode *)&(this->super_ISceneManager).field_0x8;
    if (parent != (ISceneNode *)0x0) {
      parent_00 = parent;
    }
    this_00 = (CAnimatedMeshSceneNode *)operator_new(0x1b0);
    CAnimatedMeshSceneNode::CAnimatedMeshSceneNode
              (this_00,mesh,parent_00,&this->super_ISceneManager,id,position,rotation,scale);
    lVar2 = *(long *)(*(long *)this_00 + -0x18);
    piVar1 = (int *)(&this_00->field_0x10 + lVar2);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)(&this_00->field_0x0 + lVar2) + 8))();
    }
  }
  return (IAnimatedMeshSceneNode *)this_00;
}

Assistant:

IAnimatedMeshSceneNode *CSceneManager::addAnimatedMeshSceneNode(IAnimatedMesh *mesh, ISceneNode *parent, s32 id,
		const core::vector3df &position, const core::vector3df &rotation,
		const core::vector3df &scale, bool alsoAddIfMeshPointerZero)
{
	if (!alsoAddIfMeshPointerZero && !mesh)
		return 0;

	if (!parent)
		parent = this;

	IAnimatedMeshSceneNode *node =
			new CAnimatedMeshSceneNode(mesh, parent, this, id, position, rotation, scale);
	node->drop();

	return node;
}